

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::cancel_schedulers(raft_server *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __fd;
  peer *in_RSI;
  ptr<delayed_task> *ppVar2;
  peer *this_01;
  _Hash_node_base *p_Var3;
  
  peVar1 = (this->scheduler_).
           super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    if ((this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      in_RSI = (peer *)&this->election_task_;
      (*peVar1->_vptr_delayed_task_scheduler[3])();
      LOCK();
      (((this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->cancelled_)._M_base._M_i = true;
      UNLOCK();
      in_EDX = extraout_EDX;
    }
    for (p_Var3 = (this->peers_)._M_h._M_before_begin._M_nxt; __fd = (int)in_RSI,
        p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
      this_01 = (peer *)p_Var3[2]._M_nxt;
      if (((this_01->hb_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0) &&
         (peVar1 = (this->scheduler_).
                   super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr, peVar1 != (element_type *)0x0)) {
        ppVar2 = &this_01->hb_task_;
        (*peVar1->_vptr_delayed_task_scheduler[3])();
        __fd = (int)ppVar2;
        LOCK();
        (((this_01->hb_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->cancelled_)._M_base._M_i = true;
        UNLOCK();
        this_01 = (peer *)p_Var3[2]._M_nxt;
        in_EDX = extraout_EDX_00;
      }
      peer::shutdown(this_01,__fd,in_EDX);
      in_RSI = (peer *)p_Var3[2]._M_nxt;
      clear_snapshot_sync_ctx(this,in_RSI);
      in_EDX = extraout_EDX_01;
    }
    this_00 = (this->scheduler_).
              super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->scheduler_).
    super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->scheduler_).
    super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
  }
  return;
}

Assistant:

void raft_server::cancel_schedulers() {
    if (!scheduler_) {
        // Already cancelled.
        return;
    }

    if (election_task_) {
        cancel_task(election_task_);
    }

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        const ptr<peer>& p = it->second;
        if (p->get_hb_task()) {
            cancel_task(p->get_hb_task());
        }
        // Shutdown peer to cut off smart pointers.
        p->shutdown();

        // Free user context of snapshot if exists.
        clear_snapshot_sync_ctx(*p);
    }
    scheduler_.reset();
}